

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::flattenAccess
          (HlslParseContext *this,longlong uniqueId,int member,TStorageQualifier outerStorage,
          TType *dereferencedType,int subset)

{
  int iVar1;
  longlong i;
  bool bVar2;
  EShLanguage s;
  pointer ppVar3;
  reference pvVar4;
  reference ppTVar5;
  TIntermSymbol *this_00;
  TType *s_00;
  int local_a4;
  pool_allocator<char> local_90;
  TString local_88;
  TVariable *local_60;
  TVariable *memberVariable;
  TIntermSymbol *subsetSymbol;
  iterator iStack_48;
  int newSubset;
  _Self local_40;
  iterator flattenData;
  int subset_local;
  TType *dereferencedType_local;
  TStorageQualifier outerStorage_local;
  int member_local;
  longlong uniqueId_local;
  HlslParseContext *this_local;
  
  flattenData._M_node._4_4_ = subset;
  _outerStorage_local = uniqueId;
  uniqueId_local = (longlong)this;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
       ::find(&(this->flattenMap).
               super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ,(key_type_conflict2 *)&outerStorage_local);
  iStack_48 = std::
              map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ::end(&(this->flattenMap).
                     super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                   );
  bVar2 = std::operator==(&local_40,&stack0xffffffffffffffb8);
  if (bVar2) {
    this_local = (HlslParseContext *)0x0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
             ::operator->(&local_40);
    local_a4 = member;
    if (-1 < flattenData._M_node._4_4_) {
      local_a4 = flattenData._M_node._4_4_ + member;
    }
    pvVar4 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                       (&(ppVar3->second).offsets.super_vector<int,_glslang::pool_allocator<int>_>,
                        (long)local_a4);
    subsetSymbol._4_4_ = *pvVar4;
    s_00 = dereferencedType;
    bVar2 = shouldFlatten(this,dereferencedType,outerStorage,false);
    if (bVar2) {
      this_00 = (TIntermSymbol *)TIntermNode::operator_new((TIntermNode *)0x138,(size_t)s_00);
      i = _outerStorage_local;
      pool_allocator<char>::pool_allocator(&local_90);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_88,"flattenShadow",&local_90);
      s = TParseContextBase::getLanguage(&this->super_TParseContextBase);
      TIntermSymbol::TIntermSymbol(this_00,i,&local_88,s,dereferencedType,(TString *)0x0);
      memberVariable = (TVariable *)this_00;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_88);
      TIntermSymbol::setFlattenSubset((TIntermSymbol *)memberVariable,subsetSymbol._4_4_);
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
               ::operator->(&local_40);
      pvVar4 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                         (&(ppVar3->second).offsets.super_vector<int,_glslang::pool_allocator<int>_>
                          ,(long)subsetSymbol._4_4_);
      iVar1 = *pvVar4;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
               ::operator->(&local_40);
      ppTVar5 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
                operator[]((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                            *)&ppVar3->second,(long)iVar1);
      local_60 = *ppTVar5;
      memberVariable =
           (TVariable *)
           TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,local_60);
      TIntermSymbol::setFlattenSubset((TIntermSymbol *)memberVariable,-1);
    }
    this_local = (HlslParseContext *)memberVariable;
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::flattenAccess(long long uniqueId, int member, TStorageQualifier outerStorage,
    const TType& dereferencedType, int subset)
{
    const auto flattenData = flattenMap.find(uniqueId);

    if (flattenData == flattenMap.end())
        return nullptr;

    // Calculate new cumulative offset from the packed tree
    int newSubset = flattenData->second.offsets[subset >= 0 ? subset + member : member];

    TIntermSymbol* subsetSymbol;
    if (!shouldFlatten(dereferencedType, outerStorage, false)) {
        // Finished flattening: create symbol for variable
        member = flattenData->second.offsets[newSubset];
        const TVariable* memberVariable = flattenData->second.members[member];
        subsetSymbol = intermediate.addSymbol(*memberVariable);
        subsetSymbol->setFlattenSubset(-1);
    } else {

        // If this is not the final flattening, accumulate the position and return
        // an object of the partially dereferenced type.
        subsetSymbol = new TIntermSymbol(uniqueId, "flattenShadow", getLanguage(), dereferencedType);
        subsetSymbol->setFlattenSubset(newSubset);
    }

    return subsetSymbol;
}